

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::SetupCustomTargets(cmQtAutoGenInitializer *this)

{
  Status SVar1;
  char *in_RCX;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view text;
  string local_70;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  size_type local_20;
  pointer local_18;
  
  SVar1 = cmsys::SystemTools::MakeDirectory(&(this->Dir).Info,(mode_t *)0x0);
  if (SVar1.Kind_ == Success) {
    if (((this->Moc).super_GenVarsT.Enabled != false) ||
       (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
      SetupWriteAutogenInfo(this);
    }
    if ((this->Rcc).super_GenVarsT.Enabled == true) {
      SetupWriteRccInfo(this);
    }
  }
  else {
    text._M_str = in_RCX;
    text._M_len = (size_t)(this->Dir).Info._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_(&local_50,(cmQtAutoGen *)(this->Dir).Info._M_string_length,text);
    local_30._M_len = 0x25;
    local_30._M_str = "AutoGen: Could not create directory: ";
    local_20 = local_50._M_string_length;
    local_18 = local_50._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = &local_30;
    cmCatViews_abi_cxx11_(&local_70,views);
    cmSystemTools::Error(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return SVar1.Kind_ == Success;
}

Assistant:

bool cmQtAutoGenInitializer::SetupCustomTargets()
{
  // Create info directory on demand
  if (!cmSystemTools::MakeDirectory(this->Dir.Info)) {
    cmSystemTools::Error(cmStrCat("AutoGen: Could not create directory: ",
                                  Quoted(this->Dir.Info)));
    return false;
  }

  // Generate autogen target info file
  if (this->MocOrUicEnabled()) {
    // Write autogen target info files
    if (!this->SetupWriteAutogenInfo()) {
      return false;
    }
  }

  // Write AUTORCC info files
  return !this->Rcc.Enabled || this->SetupWriteRccInfo();
}